

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::EigenBase2EigenBase,_void>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,
          HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
          *src,assign_op<double,_double> *param_3)

{
  Index IVar1;
  Index IVar2;
  Index IVar3;
  bool bVar4;
  Index dstCols;
  Index dstRows;
  assign_op<double,_double> *param_2_local;
  HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
  *src_local;
  Matrix<double,__1,__1,_0,__1,__1> *dst_local;
  
  IVar1 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::rows(src);
  IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::cols(src);
  IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  if (IVar3 == IVar1) {
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    if (IVar3 == IVar2) goto LAB_00242abd;
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,IVar1,IVar2);
LAB_00242abd:
  IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                    (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
  IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
          ::rows(src);
  bVar4 = false;
  if (IVar1 == IVar2) {
    IVar1 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    IVar2 = HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
            ::cols(src);
    bVar4 = IVar1 == IVar2;
  }
  if (!bVar4) {
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MacWen[P]CMAES/include/../3rdParty/Eigen/src/Core/AssignEvaluator.h"
                  ,0x382,
                  "static void Eigen::internal::Assignment<Eigen::Matrix<double, -1, -1>, Eigen::HouseholderSequence<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Eigen::internal::assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::assign_op<typename DstXprType::Scalar, typename SrcXprType::Scalar> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::HouseholderSequence<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>, Functor = Eigen::internal::assign_op<double, double>, Kind = Eigen::internal::EigenBase2EigenBase, EnableIf = void]"
                 );
  }
  HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
              *)src,dst);
  return;
}

Assistant:

void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<typename DstXprType::Scalar,typename SrcXprType::Scalar> &/*func*/)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);

    eigen_assert(dst.rows() == src.rows() && dst.cols() == src.cols());
    src.evalTo(dst);
  }